

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_worker_startup(void)

{
  fio_defer_task_s task;
  fio_data_s *pfVar1;
  fio_defer_thread_pool_s *pool;
  void *pvVar2;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  
  if ((fio_data->workers == 1) || (fio_data->is_worker != '\0')) {
    fio_state_callback_force(FIO_CALL_ON_START);
    fio_state_callback_clear(FIO_CALL_ON_START);
    pfVar1 = fio_data;
    if (fio_data->workers == 1) {
      fio_data->is_worker = '\x01';
      goto LAB_00108e2d;
    }
  }
  pfVar1 = fio_data;
  if (fio_data->is_worker == '\0') {
    fio_data->threads = 1;
  }
  else if (3 < FIO_LOG_LEVEL) {
    getpid();
    FIO_LOG2STDERR("INFO: %d is running.");
    pfVar1 = fio_data;
  }
LAB_00108e2d:
  pfVar1->need_review = '\x01';
  task.arg2 = (void *)0x0;
  task.func = fio_cycle;
  task.arg1 = (void *)0x0;
  fio_defer_push_task_fn(task,&task_queue_normal);
  uVar5 = (ulong)fio_data->threads;
  if (uVar5 < 2) {
    fio_defer_perform();
    return;
  }
  pool = (fio_defer_thread_pool_s *)malloc(uVar5 * 8 + 8);
  if (pool == (fio_defer_thread_pool_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:1111"
                    );
    }
    kill(0,2);
    piVar3 = __errno_location();
    exit(*piVar3);
  }
  pool->thread_count = uVar5;
  sVar4 = 0;
  do {
    if (uVar5 == sVar4) {
LAB_00108efe:
      fio_defer_thread_pool_join(pool);
      return;
    }
    pvVar2 = fio_thread_new(fio_defer_cycle,(void *)0x0);
    pool[sVar4 + 1].thread_count = (size_t)pvVar2;
    if (pvVar2 == (void *)0x0) {
      pool->thread_count = sVar4;
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("FATAL: couldn\'t spawn threads for thread pool, attempting shutdown.");
      }
      if (fio_data != (fio_data_s *)0x0) {
        fio_data->active = '\0';
      }
      fio_defer_thread_pool_join(pool);
      pool = (fio_defer_thread_pool_s *)0x0;
      goto LAB_00108efe;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

static void fio_worker_startup(void) {
  /* Call the on_start callbacks for worker processes. */
  if (fio_data->workers == 1 || fio_data->is_worker) {
    fio_state_callback_force(FIO_CALL_ON_START);
    fio_state_callback_clear(FIO_CALL_ON_START);
  }

  if (fio_data->workers == 1) {
    /* Single Process - the root is also a worker */
    fio_data->is_worker = 1;
  } else if (fio_data->is_worker) {
    /* Worker Process */
    FIO_LOG_INFO("%d is running.", (int)getpid());
  } else {
    /* Root Process should run in single thread mode */
    fio_data->threads = 1;
  }

  /* require timeout review */
  fio_data->need_review = 1;

  /* the cycle task will loop by re-scheduling until it's time to finish */
  fio_defer_push_task(fio_cycle, NULL, NULL);

  /* A single thread doesn't need a pool. */
  if (fio_data->threads > 1) {
    fio_defer_thread_pool_join(fio_defer_thread_pool_new(fio_data->threads));
  } else {
    fio_defer_perform();
  }
}